

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonParser.cpp
# Opt level: O3

string * __thiscall
Json::JsonParser::parseNumber_abi_cxx11_(string *__return_storage_ptr__,JsonParser *this,char prev)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  char cVar4;
  byte bVar5;
  uint uVar6;
  JsonException *this_00;
  ulong uVar7;
  int iVar8;
  JsonReader *pJVar9;
  size_type sVar10;
  JsonParser *this_01;
  bool bVar11;
  double d;
  
  (this->__buffer_value)._M_string_length = 0;
  *(this->__buffer_value)._M_dataplus._M_p = '\0';
  if (prev == '+') {
    bVar3 = false;
LAB_001091fb:
    pJVar9 = &this->__reader;
    cVar4 = JsonReader::get(pJVar9);
    if (cVar4 != '.') {
      uVar7 = (this->__buffer_value)._M_string_length;
      if (((uVar7 != 0) && ((byte)(cVar4 - 0x30U) < 10)) &&
         ((this->__buffer_value)._M_dataplus._M_p[uVar7 - 1] == '0')) {
        iVar8 = (this->__reader).__ptr;
        if (0 < iVar8) {
          (this->__reader).__ptr = iVar8 + -1;
        }
        this_00 = (JsonException *)__cxa_allocate_exception(0x50);
        JsonException::JsonException(this_00,pJVar9);
        goto LAB_00109510;
      }
      if (cVar4 != '-' || (byte)(prev ^ 0x2bU) != 0) {
        if ((byte)(prev ^ 0x2bU) != 0 || cVar4 != '+') {
          if ((prev != '-') || ((cVar4 - 0x2bU & 0xfd) != 0)) {
            if ((byte)(cVar4 - 0x30U) < 10) {
              bVar11 = false;
              std::__cxx11::string::_M_replace_aux((ulong)this,uVar7,0,'\x01');
            }
            else {
              iVar8 = (this->__reader).__ptr;
              if (0 < iVar8) {
                (this->__reader).__ptr = iVar8 + -1;
              }
              bVar11 = false;
            }
            goto LAB_001092d5;
          }
        }
      }
      this_00 = (JsonException *)__cxa_allocate_exception(0x50);
      JsonException::JsonException(this_00,pJVar9);
      goto LAB_00109510;
    }
    if (9 < (byte)(prev - 0x30U)) {
      std::__cxx11::string::_M_replace_aux
                ((ulong)this,(this->__buffer_value)._M_string_length,0,'\x01');
    }
    std::__cxx11::string::_M_replace_aux
              ((ulong)this,(this->__buffer_value)._M_string_length,0,'\x01');
    bVar11 = true;
  }
  else {
    if (prev == '-') {
      bVar3 = true;
      goto LAB_001091fb;
    }
    if (prev != '.') {
      bVar3 = false;
      std::__cxx11::string::_M_replace_aux
                ((ulong)this,(this->__buffer_value)._M_string_length,0,'\x01');
      goto LAB_001091fb;
    }
    std::__cxx11::string::append((char *)this);
    JsonReader::get(&this->__reader);
    iVar8 = (this->__reader).__ptr;
    bVar11 = true;
    if (0 < iVar8) {
      (this->__reader).__ptr = iVar8 + -1;
    }
    bVar3 = false;
  }
LAB_001092d5:
  pJVar9 = &this->__reader;
LAB_001092df:
  do {
    bVar5 = JsonReader::get(pJVar9);
    uVar7 = (ulong)bVar5;
    if (bVar5 < 0x21) {
      if ((0x100002600U >> (uVar7 & 0x3f) & 1) != 0) goto LAB_001092df;
    }
    if ((byte)(bVar5 - 0x30) < 10) {
      sVar10 = (this->__buffer_value)._M_string_length;
      if (((1 < (int)sVar10) && (pcVar2 = (this->__buffer_value)._M_dataplus._M_p, *pcVar2 == '0'))
         && ((byte)(pcVar2[1] - 0x30U) < 10)) {
        iVar1 = (this->__reader).__len;
        uVar6 = (this->__reader).__ptr - (int)sVar10;
        iVar8 = uVar6 + 1;
        if (iVar8 < iVar1) {
          iVar1 = iVar8;
        }
        iVar8 = 0;
        if (uVar6 < 0x7fffffff) {
          iVar8 = iVar1;
        }
        (this->__reader).__ptr = iVar8;
        this_00 = (JsonException *)__cxa_allocate_exception(0x50);
        JsonException::JsonException(this_00,pJVar9);
        goto LAB_00109510;
      }
LAB_0010937e:
      std::__cxx11::string::_M_replace_aux((ulong)this,sVar10,0,'\x01');
      goto LAB_001092df;
    }
    if (bVar5 == 0x2e) {
      if (bVar11) {
        this_00 = (JsonException *)__cxa_allocate_exception(0x50);
        JsonException::JsonException(this_00,pJVar9);
        goto LAB_00109510;
      }
      std::__cxx11::string::_M_replace_aux
                ((ulong)this,(this->__buffer_value)._M_string_length,0,'\x01');
      bVar11 = true;
      goto LAB_001092df;
    }
    if ((bVar5 == 0x65) || (bVar5 == 0x45)) {
      uVar7 = (this->__buffer_value)._M_string_length;
      if ((uVar7 == 0) || ((this->__buffer_value)._M_dataplus._M_p[uVar7 - 1] != '.')) {
        std::__cxx11::string::_M_replace_aux((ulong)this,uVar7,0,'\x01');
        cVar4 = JsonReader::get(pJVar9);
        if ((((byte)(cVar4 - 0x30U) < 10) || (cVar4 == '+')) || (cVar4 == '-')) {
          sVar10 = (this->__buffer_value)._M_string_length;
          goto LAB_0010937e;
        }
        this_00 = (JsonException *)__cxa_allocate_exception(0x50);
        JsonException::JsonException(this_00,pJVar9);
      }
      else {
        iVar8 = (this->__reader).__ptr;
        if (0 < iVar8) {
          (this->__reader).__ptr = iVar8 + -1;
        }
        this_00 = (JsonException *)__cxa_allocate_exception(0x50);
        JsonException::JsonException(this_00,pJVar9);
      }
      goto LAB_00109510;
    }
    sVar10 = (this->__buffer_value)._M_string_length;
    if ((sVar10 != 0) && ((this->__buffer_value)._M_dataplus._M_p[sVar10 - 1] == '.')) {
      this_00 = (JsonException *)__cxa_allocate_exception(0x50);
      JsonException::JsonException(this_00,pJVar9);
      goto LAB_00109510;
    }
    if (0x2c < bVar5) goto LAB_001093ec;
  } while ((0x100002600U >> (uVar7 & 0x3f) & 1) != 0);
  if (uVar7 != 0x2c) {
LAB_001093ec:
    if ((bVar5 != 0x5d) && (bVar5 != 0x7d)) {
      this_00 = (JsonException *)__cxa_allocate_exception(0x50);
      JsonException::JsonException(this_00,pJVar9);
LAB_00109510:
      __cxa_throw(this_00,&JsonException::typeinfo,JsonException::~JsonException);
    }
  }
  iVar8 = (this->__reader).__ptr;
  if (0 < iVar8) {
    (this->__reader).__ptr = iVar8 + -1;
  }
  if (bVar3) {
    std::__cxx11::string::insert((ulong)this,0,'\x01');
  }
  this_01 = (JsonParser *)0x0;
  d = strtod((this->__buffer_value)._M_dataplus._M_p,(char **)0x0);
  __num2str_abi_cxx11_(__return_storage_ptr__,this_01,d);
  return __return_storage_ptr__;
}

Assistant:

std::string Json::JsonParser::parseNumber(char prev) {
    buffer_reset();
    bool __unique = false, __negative = false;
    // -.1234 => -0.1234, .1234 => 0.1234
    if (prev == '+');
    else if (prev == '-')__negative = true;
    else if (prev == '.') {
        buffer_append("0.");
        __unique = true;
    } else buffer_append(prev);

    char c = __reader.get();
    if (!__unique) {  // +., -., 1.
        if (c == '.') {
            if (!is_number(prev)) buffer_append('0');
            buffer_append(c);
            __unique = true;
        } else if (buffer_back() == '0' && is_number(c)) {
            __reader.back();
            throw JsonException(__reader);
        } else if ((prev == '+' && c == '-') || (prev == '+' && c == '+')
                   || (prev == '-' && c == '-') || (prev == '-' && c == '+'))
            throw JsonException(__reader);
        else if (is_number(c))buffer_append(c);
        else __reader.back();
    } else __reader.back();

    for (;;) {
        char c = __reader.get();

        if (is_space_char(c)) continue;

        if (is_number(c) || c == '.' || c == 'e' || c == 'E') {
            // 1e+2, 1e-2, -1e2, .1e+2, 0.1e+2, -.1e+2, -e+2, -0e+2, .0e-3
            if (c == 'e' || c == 'E') {
                if (buffer_back() == '.') { // .E-3
                    __reader.back();
                    throw JsonException(__reader);
                }
                buffer_append(c);
                c = __reader.get();
                if (!(is_number(c) || c == '+' || c == '-')) throw JsonException(__reader);
                buffer_append(c);
            } else if (c == '.') {
                if (__unique) throw JsonException(__reader);
                buffer_append(c);
                __unique = true;
            } else {
                if (buffer_size() >= 2) {
                    if (buffer_index() == '0' && is_number(buffer_index(1))) {
                        __reader.moveTo(-(buffer_size() - 1));
                        throw JsonException(__reader);
                    }
                }
                buffer_append(c);
            }
        } else {
            if (buffer_back() == '.') throw JsonException(__reader);
            if (c == JSON_SEPARATE || c == JSON_OBJECT_END || c == JSON_ARRAY_END)break;
            if (is_space_char(c))continue;
            else throw JsonException(__reader);
        }
    }
    __reader.back();
    if (__negative)
        buffer_insert('-');
    return __num2str(strtod((buffer_str()), nullptr));
}